

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O0

void EvpathPreloadHandler
               (CManager cm,CMConnection conn,void *msg_v,void *client_Data,attr_list attrs)

{
  CManager p_Var1;
  CP_GetCManagerFunc p_Var2;
  ulong uVar3;
  ulong uVar4;
  _RSTimestepEntry *p_Var5;
  uint64_t uVar6;
  Evpath_RS_Stream in_RCX;
  ulong *in_RDX;
  undefined8 in_RDI;
  EvpathCompletionHandle Next;
  int HadPreload;
  EvpathCompletionHandle Requests;
  RSTimestepList Entry;
  CP_Services Svcs;
  Evpath_RS_Stream RS_Stream;
  EvpathPreloadMsg PreloadMsg;
  _EvpathCompletionHandle *Length;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  EvpathCompletionHandle Handle;
  Evpath_RS_Stream Stream;
  Evpath_RS_Stream Buffer;
  
  Stream = (Evpath_RS_Stream)in_RDX[3];
  Buffer = in_RCX;
  p_Var5 = (_RSTimestepEntry *)calloc(1,0x30);
  p_Var1 = in_RCX->cm;
  p_Var2 = (CP_GetCManagerFunc)Stream->CP_Stream;
  uVar4 = in_RDX[2];
  uVar3 = *in_RDX;
  uVar6 = writeBlockFingerprint((char *)in_RDX[4],in_RDX[1]);
  (*(code *)p_Var1)(p_Var2,3,
                    "Got a preload message from writer rank %d for timestep %ld, fprint %lx\n",
                    (int)uVar4,uVar3,uVar6);
  CMtake_buffer(in_RDI,in_RDX);
  p_Var5->Timestep = *in_RDX;
  p_Var5->WriterRank = (int)in_RDX[2];
  p_Var5->Data = (char *)in_RDX[4];
  p_Var5->DataSize = in_RDX[1];
  p_Var5->DataStart = 0;
  Stream->Stats->DataBytesReceived = in_RDX[1] + Stream->Stats->DataBytesReceived;
  Stream->Stats->PreloadBytesReceived = in_RDX[1] + Stream->Stats->PreloadBytesReceived;
  if (Stream->LastPreloadTimestep < *in_RDX) {
    Stream->LastPreloadTimestep = *in_RDX;
    Stream->Stats->PreloadTimestepsReceived = Stream->Stats->PreloadTimestepsReceived + 1;
  }
  pthread_mutex_lock((pthread_mutex_t *)&Stream->DataLock);
  p_Var5->Next = Stream->QueuedTimesteps;
  Stream->QueuedTimesteps = p_Var5;
  Length = Stream->PendingReadRequests;
  while (Handle = Length, Handle != (EvpathCompletionHandle)0x0) {
    Length = Handle->Next;
    in_stack_ffffffffffffffac =
         HandleRequestWithPreloaded
                   ((CP_Services)Stream,in_RCX,(int)((ulong)p_Var5 >> 0x20),(size_t)Handle,
                    CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),(size_t)Length,
                    Buffer);
    if (in_stack_ffffffffffffffac != 0) {
      CMCondition_signal(in_RDI,Handle->CMcondition);
      RemoveRequestFromList((CP_Services)in_RCX,Stream,Handle);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&Stream->DataLock);
  return;
}

Assistant:

static void EvpathPreloadHandler(CManager cm, CMConnection conn, void *msg_v, void *client_Data,
                                 attr_list attrs)
{
    EvpathPreloadMsg PreloadMsg = (EvpathPreloadMsg)msg_v;
    Evpath_RS_Stream RS_Stream = PreloadMsg->RS_Stream;
    CP_Services Svcs = (CP_Services)client_Data;
    RSTimestepList Entry = calloc(1, sizeof(*Entry));

    Svcs->verbose(RS_Stream->CP_Stream, DPPerStepVerbose,
                  "Got a preload message from writer rank %d for timestep %ld, fprint "
                  "%lx\n",
                  PreloadMsg->WriterRank, PreloadMsg->Timestep,
                  writeBlockFingerprint(PreloadMsg->Data, PreloadMsg->DataLength));
    /* arrange for this message data to stay around */
    CMtake_buffer(cm, msg_v);

    Entry->Timestep = PreloadMsg->Timestep;
    Entry->WriterRank = PreloadMsg->WriterRank;
    Entry->Data = PreloadMsg->Data;
    Entry->DataSize = PreloadMsg->DataLength;
    Entry->DataStart = 0;
    RS_Stream->Stats->DataBytesReceived += PreloadMsg->DataLength;
    RS_Stream->Stats->PreloadBytesReceived += PreloadMsg->DataLength;
    if (PreloadMsg->Timestep > RS_Stream->LastPreloadTimestep)
    {
        // only incremenet PreloadTimesteps once, even if we get multiple
        // preloads on a timestep (from different ranks)
        RS_Stream->LastPreloadTimestep = PreloadMsg->Timestep;
        RS_Stream->Stats->PreloadTimestepsReceived++;
    }
    pthread_mutex_lock(&RS_Stream->DataLock);
    Entry->Next = RS_Stream->QueuedTimesteps;
    RS_Stream->QueuedTimesteps = Entry;
    EvpathCompletionHandle Requests = RS_Stream->PendingReadRequests;
    while (Requests)
    {
        int HadPreload;
        EvpathCompletionHandle Next = Requests->Next;
        HadPreload =
            HandleRequestWithPreloaded(Svcs, RS_Stream, Requests->Rank, PreloadMsg->Timestep,
                                       Requests->Offset, Requests->Length, Requests->Buffer);
        if (HadPreload)
        {
            CMCondition_signal(cm, Requests->CMcondition);
            RemoveRequestFromList(Svcs, RS_Stream, Requests);
        }
        Requests = Next;
    }
    pthread_mutex_unlock(&RS_Stream->DataLock);
    return;
}